

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

size_t __thiscall
absl::lts_20240722::str_format_internal::(anonymous_namespace)::
PrintIntegralDigits<(absl::lts_20240722::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
          (_anonymous_namespace_ *this,unsigned___int128 digits,Buffer *out)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  size_t sVar4;
  undefined1 *in_RDX;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  auVar3._8_8_ = out;
  auVar3._0_8_ = this;
  if (this == (_anonymous_namespace_ *)0x0 && out == (Buffer *)0x0) {
    sVar4 = 0;
  }
  else {
    do {
      lVar5 = auVar3._8_8_;
      uVar6 = auVar3._0_8_;
      puVar2 = *(undefined1 **)(in_RDX + 0x58);
      if (puVar2 <= in_RDX) goto LAB_0010dfa7;
      auVar7 = __udivti3(uVar6,lVar5,10,0);
      *(undefined1 **)(in_RDX + 0x58) = puVar2 + -1;
      puVar2[-1] = auVar3[0] + auVar7[0] * -10 | 0x30;
      auVar3 = auVar7;
    } while (lVar5 != 0 || (ulong)-lVar5 < (ulong)(9 < uVar6));
    puVar2 = *(undefined1 **)(in_RDX + 0x58);
    if (puVar2 <= in_RDX) {
LAB_0010dfa7:
      __assert_fail("begin > data",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                    ,0x3ee,
                    "void absl::str_format_internal::(anonymous namespace)::Buffer::push_front(char)"
                   );
    }
    uVar1 = *puVar2;
    sVar4 = *(long *)(in_RDX + 0x60) - (long)puVar2;
    *(undefined1 **)(in_RDX + 0x58) = puVar2 + -1;
    puVar2[-1] = uVar1;
    *(undefined1 *)(*(long *)(in_RDX + 0x58) + 1) = 0x2e;
  }
  return sVar4;
}

Assistant:

size_t PrintIntegralDigits(Int digits, Buffer* out) {
  size_t printed = 0;
  if (digits) {
    for (; digits; digits /= 10) out->push_front(digits % 10 + '0');
    printed = out->size();
    if (mode == FormatStyle::Precision) {
      out->push_front(*out->begin);
      out->begin[1] = '.';
    } else {
      out->push_back('.');
    }
  } else if (mode == FormatStyle::Fixed) {
    out->push_front('0');
    out->push_back('.');
    printed = 1;
  }
  return printed;
}